

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O2

ObjectPtr __thiscall ICM::DefFunc::System::Type::func(Type *this,DataList *list)

{
  DataObject<(ICM::DefaultType)14> *this_00;
  long in_RDX;
  T local_20;
  
  this_00 = (DataObject<(ICM::DefaultType)14> *)operator_new(0x10);
  local_20.data = *(TypeUnit *)**(undefined8 **)(in_RDX + 8);
  Objects::DataObject<(ICM::DefaultType)14>::DataObject(this_00,&local_20);
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)this_00;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					return ObjectPtr(new Objects::Type(list[0]->type));
				}